

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

int ON_Internal_CompareNgonEdge(void *lhs,void *rhs)

{
  uint uVar1;
  uint uVar2;
  int j;
  int i;
  void *rhs_local;
  void *lhs_local;
  
  uVar1 = (uint)(*(uint *)((long)lhs + 4) < *lhs);
  uVar2 = (uint)(*(uint *)((long)rhs + 4) < *rhs);
  if (*(uint *)((long)lhs + (long)(int)uVar1 * 4) < *(uint *)((long)rhs + (long)(int)uVar2 * 4)) {
    lhs_local._4_4_ = -1;
  }
  else if (*(uint *)((long)rhs + (long)(int)uVar2 * 4) < *(uint *)((long)lhs + (long)(int)uVar1 * 4)
          ) {
    lhs_local._4_4_ = 1;
  }
  else if (*(uint *)((long)lhs + (long)(int)(1 - uVar1) * 4) <
           *(uint *)((long)rhs + (long)(int)(1 - uVar2) * 4)) {
    lhs_local._4_4_ = -1;
  }
  else if (*(uint *)((long)rhs + (long)(int)(1 - uVar2) * 4) <
           *(uint *)((long)lhs + (long)(int)(1 - uVar1) * 4)) {
    lhs_local._4_4_ = 1;
  }
  else if (*(uint *)((long)lhs + 8) < *(uint *)((long)rhs + 8)) {
    lhs_local._4_4_ = -1;
  }
  else if (*(uint *)((long)rhs + 8) < *(uint *)((long)lhs + 8)) {
    lhs_local._4_4_ = 1;
  }
  else {
    lhs_local._4_4_ = 0;
  }
  return lhs_local._4_4_;
}

Assistant:

static int ON_Internal_CompareNgonEdge(
  const void* lhs,
  const void* rhs
)
{
  const int i = (((const unsigned int*)lhs)[0] <= ((const unsigned int*)lhs)[1]) ? 0 : 1;
  const int j = (((const unsigned int*)rhs)[0] <= ((const unsigned int*)rhs)[1]) ? 0 : 1;
  if (((const unsigned int*)lhs)[i] < ((const unsigned int*)rhs)[j])
    return -1;
  if (((const unsigned int*)lhs)[i] > ((const unsigned int*)rhs)[j])
    return 1;
  if (((const unsigned int*)lhs)[1-i] < ((const unsigned int*)rhs)[1-j])
    return -1;
  if (((const unsigned int*)lhs)[1-i] > ((const unsigned int*)rhs)[1-j])
    return 1;
  if (((const unsigned int*)lhs)[2] < ((const unsigned int*)rhs)[2])
    return -1;
  if (((const unsigned int*)lhs)[2] > ((const unsigned int*)rhs)[2])
    return 1;
  return 0;  
}